

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O3

void henson::Scheduler::create_group
               (size_t first,size_t last,MPI_Comm parent_comm,MPI_Group *new_group)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  MPI_Group parent_group;
  vector<int,_std::allocator<int>_> group_array;
  allocator_type local_49;
  undefined8 local_48;
  value_type_conflict2 local_3c;
  vector<int,_std::allocator<int>_> local_38;
  
  MPI_Comm_group(parent_comm,&local_48);
  local_3c = -1;
  std::vector<int,_std::allocator<int>_>::vector(&local_38,(last - first) + 1,&local_3c,&local_49);
  auVar1 = _DAT_00269020;
  lVar5 = (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    lVar2 = lVar5 + (ulong)(lVar5 == 0);
    lVar3 = lVar2 + -1;
    auVar7._8_4_ = (int)lVar3;
    auVar7._0_8_ = lVar3;
    auVar7._12_4_ = (int)((ulong)lVar3 >> 0x20);
    uVar4 = 0;
    auVar7 = auVar7 ^ _DAT_00269020;
    auVar8 = _DAT_00272980;
    do {
      auVar9 = auVar8 ^ auVar1;
      iVar6 = (int)first;
      if ((bool)(~(auVar9._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar9._0_4_ ||
                  auVar7._4_4_ < auVar9._4_4_) & 1)) {
        local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar4] = iVar6;
      }
      if ((auVar9._12_4_ != auVar7._12_4_ || auVar9._8_4_ <= auVar7._8_4_) &&
          auVar9._12_4_ <= auVar7._12_4_) {
        local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar4 + 1] = iVar6 + 1;
      }
      uVar4 = uVar4 + 2;
      lVar3 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar3 + 2;
      first = (size_t)(iVar6 + 2);
    } while ((lVar2 + 1U & 0xfffffffffffffffe) != uVar4);
  }
  MPI_Group_incl(local_48,lVar5,
                 local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,new_group);
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void create_group(size_t first, size_t last, MPI_Comm parent_comm, MPI_Group* new_group)
        {
            MPI_Group parent_group;
            MPI_Comm_group(parent_comm, &parent_group);

            std::vector<int> group_array(last - first + 1, -1);
            for(size_t i = 0; i < group_array.size(); ++i)
                group_array[i] = first + i;

            MPI_Group_incl(parent_group, group_array.size(), group_array.data(), new_group);
        }